

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O0

void __thiscall
despot::PlannerBase::InitializeLogger
          (PlannerBase *this,Logger **logger,Option *options,DSPOMDP *model,Belief *belief,
          Solver *solver,int num_runs,clock_t main_clock_start,World *world,string *world_type,
          int time_limit,string *solver_type)

{
  Solver *pSVar1;
  Solver *pSVar2;
  Belief *pBVar3;
  Logger *pLVar4;
  string local_88;
  undefined1 local_65;
  string local_58;
  Solver *local_38;
  Solver *solver_local;
  Belief *belief_local;
  DSPOMDP *model_local;
  Option *options_local;
  Logger **logger_local;
  PlannerBase *this_local;
  
  local_38 = solver;
  solver_local = (Solver *)belief;
  belief_local = (Belief *)model;
  model_local = (DSPOMDP *)options;
  options_local = (Option *)logger;
  logger_local = (Logger **)this;
  if (time_limit == -1) {
    pLVar4 = (Logger *)operator_new(0xb0);
    pBVar3 = belief_local;
    pSVar2 = solver_local;
    pSVar1 = local_38;
    std::__cxx11::string::string((string *)&local_88,(string *)world_type);
    Logger::Logger(pLVar4,(DSPOMDP *)pBVar3,(Belief *)pSVar2,pSVar1,world,&local_88,main_clock_start
                   ,(ostream *)&std::cout,-1.0,-1);
    options_local->next_ = (Option *)pLVar4;
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    pLVar4 = (Logger *)operator_new(0xb0);
    pBVar3 = belief_local;
    pSVar2 = solver_local;
    pSVar1 = local_38;
    local_65 = 1;
    std::__cxx11::string::string((string *)&local_58,(string *)world_type);
    Logger::Logger(pLVar4,(DSPOMDP *)pBVar3,(Belief *)pSVar2,pSVar1,world,&local_58,main_clock_start
                   ,(ostream *)&std::cout,EvalLog::curr_inst_start_time + (double)time_limit,
                   num_runs * DAT_00278a68);
    local_65 = 0;
    options_local->next_ = (Option *)pLVar4;
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void PlannerBase::InitializeLogger(Logger *&logger,
		option::Option *options, DSPOMDP *model, Belief* belief, Solver *solver,
		int num_runs, clock_t main_clock_start, World* world, string world_type,
		int time_limit, string solver_type) {

	if (time_limit != -1) {
		logger = new Logger(model, belief, solver, world, world_type,
				main_clock_start, &cout,
				EvalLog::curr_inst_start_time + time_limit,
				num_runs * Globals::config.sim_len);
	} else {
		logger = new Logger(model, belief, solver, world, world_type,
				main_clock_start, &cout);
	}
}